

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O3

MatrixXd * lf::io::anon_unknown_1::AuxNodesSegment(MatrixXd *__return_storage_ptr__,uchar order)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  MatrixXd *extraout_RAX;
  uint uVar3;
  stringstream ss;
  string local_220;
  string local_200;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  Index local_1c0;
  double dStack_1b8;
  bool local_1b0;
  undefined7 uStack_1af;
  undefined1 local_1a8 [16];
  double local_198;
  double dStack_190;
  Index local_188;
  double dStack_180;
  bool local_178;
  undefined7 uStack_177;
  
  if (order < 2) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"order <= 1",10);
    local_1e0._0_8_ = &local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"order > 1","");
    paVar2 = &local_220.field_2;
    local_220._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_1e0,&local_220,0x1e0,&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ != &local_1d0) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
    }
    local_1e0._0_8_ = &local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"false","");
    local_220._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
               ,"");
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
    lf::base::AssertionFailed((string *)local_1e0,&local_220,0x1e0,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)local_1e0);
    abort();
  }
  uVar3 = order - 1;
  local_1a8._0_8_ = (undefined8)order;
  local_1a8._8_8_ = ((double)local_1a8._0_8_ + -1.0) / (double)local_1a8._0_8_;
  lVar1 = (ulong)uVar3 - 1;
  if (uVar3 != 1) {
    local_1a8._0_8_ = 1.0 / (double)local_1a8._0_8_;
    local_198 = (double)lVar1;
  }
  else {
    local_198 = 4.94065645841247e-324;
    local_1a8._0_8_ = local_1a8._8_8_;
  }
  dStack_190 = 0.0;
  if (uVar3 != 1) {
    dStack_190 = ((double)local_1a8._8_8_ - (double)local_1a8._0_8_) / (double)lVar1;
  }
  local_188 = CONCAT71(local_188._1_7_,ABS((double)local_1a8._8_8_) < ABS((double)local_1a8._0_8_));
  Eigen::
  CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
  CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_1e0,(ulong)uVar3,1,(linspaced_op<double> *)local_1a8);
  local_1a8._0_8_ = local_1e0._0_8_;
  local_1a8._8_8_ = local_1e0._8_8_;
  local_198 = (double)local_1d0._M_allocated_capacity;
  dStack_190 = (double)local_1d0._8_8_;
  local_188 = local_1c0;
  dStack_180 = dStack_1b8;
  local_178 = local_1b0;
  uStack_177 = uStack_1af;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::Transpose<const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)local_1a8);
  return extraout_RAX;
}

Assistant:

Eigen::MatrixXd AuxNodesSegment(unsigned char order) {
  LF_ASSERT_MSG(order > 1, "order <= 1");
  return Eigen::VectorXd::LinSpaced(order - 1, 1. / (order),
                                    (order - 1.) / order)
      .transpose();
}